

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O2

mz_zip_error mz_zip_get_last_error(mz_zip_archive *pZip)

{
  mz_zip_error mVar1;
  
  if (pZip != (mz_zip_archive *)0x0) {
    mVar1 = pZip->m_last_error;
    pZip->m_last_error = MZ_ZIP_NO_ERROR;
    return mVar1;
  }
  return MZ_ZIP_INVALID_PARAMETER;
}

Assistant:

mz_zip_error mz_zip_get_last_error(mz_zip_archive *pZip)
{
    mz_zip_error prev_err;

    if (!pZip)
        return MZ_ZIP_INVALID_PARAMETER;

    prev_err = pZip->m_last_error;

    pZip->m_last_error = MZ_ZIP_NO_ERROR;
    return prev_err;
}